

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

int zt_opt_intmax(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  char *__nptr;
  int *piVar1;
  intmax_t iVar2;
  int args_consumed;
  char *end;
  int local_44;
  zt_opt_def_t *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_44 = 0;
  local_40 = def;
  __nptr = zt_opt_get_value(argn,defn,argv,def,&local_44,error);
  piVar1 = __errno_location();
  *piVar1 = 0;
  iVar2 = strtoimax(__nptr,&local_38,0);
  if (*piVar1 != 0) {
    (*error)(*piVar1,"invalid number \'%s\'",__nptr);
  }
  if ((local_38 != (char *)0x0) && (*local_38 != '\0')) {
    (*error)(0x16,"\'%s\' is not a number",__nptr);
  }
  if ((intmax_t *)local_40[defn].cb_data != (intmax_t *)0x0) {
    *(intmax_t *)local_40[defn].cb_data = iVar2;
  }
  return local_44;
}

Assistant:

int
zt_opt_intmax(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    intmax_t result;
    char   * end = NULL;
    int      args_consumed = 0;
    char   * arg = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    errno  = 0;
    result = strtoimax(arg, &end, 0);

    if (errno) {
        /* check errno */
        error(errno, "invalid number '%s'", arg);
    }

    if (end && *end) {
        /* invalid character */
        error(EINVAL, "'%s' is not a number", arg);
    }

    if (def[defn].cb_data) {
        *(intmax_t *)def[defn].cb_data = result;
    }

    return args_consumed;
}